

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int mp_check_exact(char **data,char *end)

{
  int iVar1;
  undefined1 local_58 [8];
  mp_check_error err;
  char *begin;
  char *end_local;
  char **data_local;
  
  err._40_8_ = *data;
  iVar1 = mp_check(data,end);
  if (iVar1 == 0) {
    if (*data == end) {
      data_local._4_4_ = 0;
    }
    else {
      local_58._0_4_ = MP_CHECK_ERROR_JUNK;
      err._0_8_ = err._40_8_;
      err.end = *data;
      err.data = end;
      (*mp_check_on_error)((mp_check_error *)local_58);
      data_local._4_4_ = 1;
    }
  }
  else {
    data_local._4_4_ = 1;
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL int
mp_check_exact(const char **data, const char *end)
{
	const char *begin = *data;
	if (mp_check(data, end) != 0)
		return 1;
	if (*data != end) {
		struct mp_check_error err;
		err.type = MP_CHECK_ERROR_JUNK;
		err.data = begin;
		err.end = end;
		err.pos = *data;
		mp_check_on_error(&err);
		return 1;
	}
	return 0;
}